

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenOperator(Lexer *this)

{
  bool bVar1;
  ulong uVar2;
  Lexer *in_RSI;
  Position local_80;
  undefined4 local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_3a [2];
  undefined1 local_38 [6];
  TokenType operatorType;
  string op;
  Lexer *this_local;
  
  std::__cxx11::string::string((string *)local_38);
  local_3a = (undefined1  [2])0x0;
  while( true ) {
    std::operator+(&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   (char)in_RSI->currentChar);
    bVar1 = _hasOperatorStr(&local_60,(TokenType *)local_3a);
    std::__cxx11::string::~string((string *)&local_60);
    if (!bVar1) break;
    std::__cxx11::string::operator+=((string *)local_38,(char)in_RSI->currentChar);
    nextChar(in_RSI);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::
    unique_ptr<std::default_delete<pfederc::Token>,void>
              ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)this,(nullptr_t)0x0
              );
    goto LAB_00111c7b;
  }
  if (local_3a == (undefined1  [2])0x52) {
    if (in_RSI->currentChar == 0x2a) {
      nextRegionComment(this);
      goto LAB_00111c7b;
    }
    if (in_RSI->currentChar == 0x2f) {
      nextLineComment(this);
      goto LAB_00111c7b;
    }
  }
  getCurrentCursor(&local_80,in_RSI);
  std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType&,pfederc::Position>
            ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)local_3a);
LAB_00111c7b:
  local_64 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenOperator() noexcept {
  std::string op;
  TokenType operatorType = TokenType::TOK_ERR;
  while (_hasOperatorStr(op + (char) currentChar, operatorType)) {
    op += (char) currentChar;
    nextChar();
  }
  // no match
  if (op.empty())
    return nullptr;

  // if match check if comment (starting with '/')
  if (operatorType == TokenType::TOK_OP_DIV) {
    if (currentChar == '*') // region comment
      return nextRegionComment();
    else if (currentChar == '/') // one line comment
      return nextLineComment();
  }

  return std::make_unique<Token>(currentToken, operatorType, getCurrentCursor());
}